

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

void __thiscall
avro::GenericDatum::GenericDatum<avro::GenericArray>
          (GenericDatum *this,NodePtr *schema,GenericArray *v)

{
  GenericArray *this_00;
  
  this->type_ = schema->px->type_;
  (this->value_).content = (placeholder *)0x0;
  init(this,(EVP_PKEY_CTX *)schema);
  this_00 = boost::any_cast<avro::GenericArray>(&this->value_);
  GenericArray::operator=(this_00,v);
  return;
}

Assistant:

GenericDatum(const NodePtr& schema, const T& v) :
        type_(schema->type()) {
        init(schema);
        value<T>() = v;
    }